

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O2

Accel * __thiscall
embree::BVH4Factory::BVH4InstanceMB(BVH4Factory *this,Scene *scene,bool isExpensive)

{
  BVHN<4> *this_00;
  Builder *builder;
  AccelInstance *this_01;
  Intersectors intersectors;
  Intersectors local_140;
  
  this_00 = (BVHN<4> *)BVHN<4>::operator_new(0x240);
  BVHN<4>::BVHN(this_00,(PrimitiveType *)&InstancePrimitive::type,scene);
  BVH4InstanceMBIntersectors(&local_140,this,this_00);
  builder = (*this->BVH4InstanceMBSceneBuilderSAH)
                      (this_00,scene,(ulong)((uint)isExpensive << 0x1e) + MTY_INSTANCE_CHEAP);
  this_01 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_01,(AccelData *)this_00,builder,&local_140);
  return &this_01->super_Accel;
}

Assistant:

Accel* BVH4Factory::BVH4InstanceMB(Scene* scene, bool isExpensive)
  {
    BVH4* accel = new BVH4(InstancePrimitive::type,scene);
    Accel::Intersectors intersectors = BVH4InstanceMBIntersectors(accel);
    auto gtype = isExpensive ? Geometry::MTY_INSTANCE_EXPENSIVE : Geometry::MTY_INSTANCE_CHEAP;
    Builder* builder = BVH4InstanceMBSceneBuilderSAH(accel,scene,gtype);
    return new AccelInstance(accel,builder,intersectors);
  }